

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_print_integer.c
# Opt level: O1

void intformat(intmax_t value,_PDCLIB_status_t *status)

{
  uint uVar1;
  int iVar2;
  char cVar3;
  ulong uVar4;
  undefined1 uVar5;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  char preface [3];
  undefined2 local_2c;
  undefined1 local_2a;
  
  local_2a = 0;
  local_2c = 0;
  if (status->prec < 0) {
    status->prec = 1;
  }
  uVar1 = status->flags;
  if ((uVar1 & 4) == 0) {
LAB_00108aaf:
    lVar9 = 0;
  }
  else {
    iVar2 = status->base;
    if (iVar2 != 0x10) {
      if (value != 0 && iVar2 == 8) goto LAB_00108c44;
      goto LAB_00108aaf;
    }
    if (value == 0) goto LAB_00108aaf;
LAB_00108c44:
    local_2c = 0x30;
    lVar9 = 1;
    if (iVar2 == 0x10) {
      local_2c = CONCAT11(((byte)(uVar1 >> 0x10) & 1) << 5,0x30) | 0x5800;
      lVar9 = 2;
    }
  }
  if (value < 0) {
    uVar5 = 0x2d;
  }
  else if (((uVar1 >> 0x11 & 1) != 0) ||
          ((uVar5 = 0x2b, (uVar1 & 2) == 0 && (uVar5 = 0x20, (uVar1 & 8) == 0)))) goto LAB_00108ae9;
  *(undefined1 *)((long)&local_2c + lVar9) = uVar5;
  lVar9 = lVar9 + 1;
LAB_00108ae9:
  uVar10 = (ulong)status->prec;
  uVar4 = status->current;
  if ((uVar1 & 0x11) == 0) {
    uVar6 = uVar10;
    if (uVar10 < uVar4) {
      uVar6 = uVar4;
    }
    uVar6 = uVar6 + lVar9;
    if ((uVar6 < status->width) && (status->width != uVar6)) {
      uVar8 = 0;
      do {
        if (status->i < status->n) {
          if ((FILE *)status->stream == (FILE *)0x0) {
            status->s[status->i] = ' ';
          }
          else {
            putc(0x20,(FILE *)status->stream);
          }
        }
        status->i = status->i + 1;
        status->current = status->current + 1;
        uVar8 = uVar8 + 1;
      } while (uVar8 < status->width - uVar6);
    }
  }
  if ((char)local_2c != '\0') {
    pcVar7 = (char *)((long)&local_2c + 1);
    cVar3 = (char)local_2c;
    do {
      if (status->i < status->n) {
        if ((FILE *)status->stream == (FILE *)0x0) {
          status->s[status->i] = cVar3;
        }
        else {
          putc((int)cVar3,(FILE *)status->stream);
        }
      }
      status->i = status->i + 1;
      status->current = status->current + 1;
      cVar3 = *pcVar7;
      pcVar7 = pcVar7 + 1;
    } while (cVar3 != '\0');
  }
  if (uVar4 < uVar10) {
    if (uVar4 >= uVar10) {
      uVar4 = uVar10;
    }
    lVar9 = uVar4 - uVar10;
    do {
      if (status->i < status->n) {
        if ((FILE *)status->stream == (FILE *)0x0) {
          status->s[status->i] = '0';
        }
        else {
          putc(0x30,(FILE *)status->stream);
        }
      }
      status->i = status->i + 1;
      status->current = status->current + 1;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0);
  }
  if ((status->flags & 0x11U) == 0x10) {
    uVar4 = status->current;
    while (uVar4 < status->width) {
      if (status->i < status->n) {
        if ((FILE *)status->stream == (FILE *)0x0) {
          status->s[status->i] = '0';
        }
        else {
          putc(0x30,(FILE *)status->stream);
        }
      }
      status->i = status->i + 1;
      uVar4 = status->current + 1;
      status->current = uVar4;
    }
  }
  return;
}

Assistant:

static void intformat( intmax_t value, struct _PDCLIB_status_t * status )
{
    /* At worst, we need two prefix characters (hex prefix). */
    char preface[3] = "\0";
    size_t preidx = 0;

    if ( status->prec < 0 )
    {
        status->prec = 1;
    }

    if ( ( status->flags & E_alt ) && ( status->base == 16 || status->base == 8 ) && ( value != 0 ) )
    {
        /* Octal / hexadecimal prefix for "%#" conversions */
        preface[ preidx++ ] = '0';

        if ( status->base == 16 )
        {
            preface[ preidx++ ] = ( status->flags & E_lower ) ? 'x' : 'X';
        }
    }

    if ( value < 0 )
    {
        /* Negative sign for negative values - at all times. */
        preface[ preidx++ ] = '-';
    }
    else if ( !( status->flags & E_unsigned ) )
    {
        /* plus sign / extra space are only for signed conversions */
        if ( status->flags & E_plus )
        {
            preface[ preidx++ ] = '+';
        }
        else
        {
            if ( status->flags & E_space )
            {
                preface[ preidx++ ] = ' ';
            }
        }
    }

    {
        /* At this point, status->current has the number of digits queued up.
           Determine if we have a precision requirement to pad those.
        */
        size_t prec_pads = ( ( _PDCLIB_size_t )status->prec > status->current ) ? ( ( _PDCLIB_size_t )status->prec - status->current ) : 0;

        if ( !( status->flags & ( E_minus | E_zero ) ) )
        {
            /* Space padding is only done if no zero padding or left alignment
               is requested. Calculate the number of characters that WILL be
               printed, including any prefixes determined above.
            */
            /* The number of characters to be printed, plus prefixes if any. */
            /* This line contained probably the most stupid, time-wasting bug
               I've ever perpetrated. Greetings to Samface, DevL, and all
               sceners at Breakpoint 2006.
            */
            size_t characters = preidx + ( ( status->current > ( _PDCLIB_size_t )status->prec ) ? status->current : ( _PDCLIB_size_t )status->prec );

            if ( status->width > characters )
            {
                size_t i;

                for ( i = 0; i < status->width - characters; ++i )
                {
                    PUT( ' ' );
                    ++( status->current );
                }
            }
        }

        /* Now we did the padding, do the prefixes (if any). */
        preidx = 0;

        while ( preface[ preidx ] != '\0' )
        {
            PUT( preface[ preidx++ ] );
            ++( status->current );
        }

        /* Do the precision padding if necessary. */
        while ( prec_pads-- > 0 )
        {
            PUT( '0' );
            ++( status->current );
        }

        if ( ( !( status->flags & E_minus ) ) && ( status->flags & E_zero ) )
        {
            /* If field is not left aligned, and zero padding is requested, do
               so.
            */
            while ( status->current < status->width )
            {
                PUT( '0' );
                ++( status->current );
            }
        }
    }
}